

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::clear(Tree *this)

{
  long lVar1;
  
  _clear_range(this,0,this->m_cap);
  this->m_size = 0;
  if (this->m_buf == (NodeData *)0x0) {
    *(undefined4 *)&this->m_free_head = 0xffffffff;
    *(undefined4 *)((long)&this->m_free_head + 4) = 0xffffffff;
    *(undefined4 *)&this->m_free_tail = 0xffffffff;
    *(undefined4 *)((long)&this->m_free_tail + 4) = 0xffffffff;
  }
  else {
    this->m_free_head = 0;
    this->m_free_tail = this->m_cap - 1;
    _claim_root(this);
  }
  for (lVar1 = 0x60; lVar1 != 0x100; lVar1 = lVar1 + 0x28) {
    *(undefined1 (*) [16])((long)(this->m_tag_directives + -2) + lVar1) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)this->m_tag_directives + lVar1 + -0x60) = (undefined1  [16])0x0;
    *(undefined8 *)((long)this->m_tag_directives + lVar1 + -0x40) = 0;
  }
  return;
}

Assistant:

void Tree::clear()
{
    _clear_range(0, m_cap);
    m_size = 0;
    if(m_buf)
    {
        _RYML_CB_ASSERT(m_callbacks, m_cap >= 0);
        m_free_head = 0;
        m_free_tail = m_cap-1;
        _claim_root();
    }
    else
    {
        m_free_head = NONE;
        m_free_tail = NONE;
    }
    for(size_t i = 0; i < RYML_MAX_TAG_DIRECTIVES; ++i)
        m_tag_directives[i] = {};
}